

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.h
# Opt level: O2

bool __thiscall
presolve::HighsPostsolveStack::duplicateColumn
          (HighsPostsolveStack *this,double colScale,double colLower,double colUpper,
          double duplicateColLower,double duplicateColUpper,HighsInt col,HighsInt duplicateCol,
          bool colIntegral,bool duplicateColIntegral,double ok_merge_tolerance)

{
  pointer piVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  DuplicateColumn debug_values;
  
  piVar1 = (this->origColIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  debug_values.col = piVar1[col];
  lVar3 = (long)debug_values.col;
  debug_values.duplicateCol = piVar1[duplicateCol];
  lVar4 = (long)debug_values.duplicateCol;
  debug_values.colScale = colScale;
  debug_values.colLower = colLower;
  debug_values.colUpper = colUpper;
  debug_values.duplicateColLower = duplicateColLower;
  debug_values.duplicateColUpper = duplicateColUpper;
  debug_values.colIntegral = colIntegral;
  debug_values.duplicateColIntegral = duplicateColIntegral;
  bVar2 = DuplicateColumn::okMerge(&debug_values,ok_merge_tolerance);
  if (bVar2) {
    HighsDataStack::push<presolve::HighsPostsolveStack::DuplicateColumn,_0>
              (&this->reductionValues,&debug_values);
    reductionAdded(this,kDuplicateColumn);
    (this->linearlyTransformable).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start[lVar3] = '\0';
    (this->linearlyTransformable).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start[lVar4] = '\0';
  }
  return bVar2;
}

Assistant:

bool duplicateColumn(double colScale, double colLower, double colUpper,
                       double duplicateColLower, double duplicateColUpper,
                       HighsInt col, HighsInt duplicateCol, bool colIntegral,
                       bool duplicateColIntegral,
                       const double ok_merge_tolerance) {
    const HighsInt origCol = origColIndex[col];
    const HighsInt origDuplicateCol = origColIndex[duplicateCol];
    DuplicateColumn debug_values = {
        colScale,          colLower,          colUpper,
        duplicateColLower, duplicateColUpper, origCol,
        origDuplicateCol,  colIntegral,       duplicateColIntegral};
    const bool ok_merge = debug_values.okMerge(ok_merge_tolerance);
    const bool prevent_illegal_merge = true;
    if (!ok_merge && prevent_illegal_merge) return false;
    reductionValues.push(debug_values);
    //    reductionValues.push(DuplicateColumn{
    //        colScale, colLower, colUpper, duplicateColLower,
    //        duplicateColUpper, origCol, origDuplicateCol, colIntegral,
    //        duplicateColIntegral});

    reductionAdded(ReductionType::kDuplicateColumn);

    // mark columns as not linearly transformable
    linearlyTransformable[origCol] = false;
    linearlyTransformable[origDuplicateCol] = false;
    return true;
  }